

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void thinning(Mat *im)

{
  int iVar1;
  _InputArray local_240;
  _OutputArray local_228;
  _InputArray local_210;
  undefined8 local_1f8;
  Mat prev;
  Mat diff;
  
  _diff = 0x2010000;
  cv::Mat::convertTo((_OutputArray *)im,(int)&diff,0.00392156862745098,0.0);
  local_1f8 = CONCAT44((int)**(undefined8 **)(im + 0x40),
                       (int)((ulong)**(undefined8 **)(im + 0x40) >> 0x20));
  cv::Mat::zeros((MatExpr *)&diff,&local_1f8,0);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&prev);
  cv::MatExpr::~MatExpr((MatExpr *)&diff);
  cv::Mat::Mat(&diff);
  do {
    thinningIteration(im,0);
    thinningIteration(im,1);
    local_240.sz.width = 0;
    local_240.sz.height = 0;
    local_240.flags = 0x1010000;
    local_210.sz.width = 0;
    local_210.sz.height = 0;
    local_228.super__InputArray.sz.width = 0;
    local_228.super__InputArray.sz.height = 0;
    local_210.flags = 0x1010000;
    local_228.super__InputArray.flags = 0x2010000;
    local_240.obj = im;
    local_228.super__InputArray.obj = (MatExpr *)&diff;
    local_210.obj = (MatExpr *)&prev;
    cv::absdiff(&local_240,&local_210,&local_228);
    local_240.sz.width = 0;
    local_240.sz.height = 0;
    local_240.flags = 0x2010000;
    local_240.obj = (MatExpr *)&prev;
    cv::Mat::copyTo((_OutputArray *)im);
    local_240.sz.width = 0;
    local_240.sz.height = 0;
    local_240.flags = 0x1010000;
    local_240.obj = (MatExpr *)&diff;
    iVar1 = cv::countNonZero(&local_240);
  } while (0 < iVar1);
  local_240.sz.width = 0;
  local_240.sz.height = 0;
  local_240.flags = 0x2010000;
  local_240.obj = im;
  cv::Mat::convertTo((_OutputArray *)im,(int)&local_240,255.0,0.0);
  cv::Mat::~Mat(&diff);
  cv::Mat::~Mat(&prev);
  return;
}

Assistant:

void thinning(cv::Mat& im)
{
    im /= 255;
 
    cv::Mat prev = cv::Mat::zeros(im.size(), CV_8UC1);
    cv::Mat diff;
 
    do {
        thinningIteration(im, 0);
        thinningIteration(im, 1);
        cv::absdiff(im, prev, diff);
        im.copyTo(prev);
    } 
    while (cv::countNonZero(diff) > 0);
 
    im *= 255;
}